

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotShadedEx<ImPlot::GetterXsYs<unsigned_char>,ImPlot::GetterXsYs<unsigned_char>>
               (char *label_id,GetterXsYs<unsigned_char> *getter1,GetterXsYs<unsigned_char> *getter2
               ,bool fit2)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uchar *puVar9;
  uchar *puVar10;
  ImPlotPlot *pIVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  double dVar16;
  ImPlotRange *pIVar17;
  ImPlotContext *pIVar18;
  bool bVar19;
  uint uVar20;
  ImU32 col;
  long lVar21;
  ImDrawList *DrawList;
  undefined7 in_register_00000009;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  byte local_88;
  byte local_84;
  TransformerLinLin local_7c;
  GetterXsYs<unsigned_char> *local_78;
  GetterXsYs<unsigned_char> *local_70;
  undefined4 local_64;
  ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYs<unsigned_char>,_ImPlot::TransformerLinLin>
  local_60;
  
  bVar19 = BeginItem(label_id,1);
  pIVar18 = GImPlot;
  if (bVar19) {
    if (GImPlot->FitThisFrame == true) {
      local_64 = (undefined4)CONCAT71(in_register_00000009,fit2);
      iVar3 = getter1->Count;
      if (0 < iVar3) {
        puVar9 = getter1->Xs;
        puVar10 = getter1->Ys;
        iVar4 = getter1->Offset;
        iVar5 = getter1->Stride;
        pIVar11 = GImPlot->CurrentPlot;
        iVar6 = pIVar11->CurrentYAxis;
        uVar7 = (pIVar11->XAxis).Flags;
        pIVar17 = GImPlot->ExtentsY;
        uVar8 = pIVar11->YAxis[iVar6].Flags;
        iVar23 = 0;
        uVar20 = uVar7 & 0x20;
        uVar22 = uVar8 & 0x20;
        do {
          lVar21 = (long)(((iVar4 + iVar23) % iVar3 + iVar3) % iVar3) * (long)iVar5;
          bVar1 = puVar9[lVar21];
          dVar27 = (double)bVar1;
          bVar2 = puVar10[lVar21];
          dVar14 = (double)bVar2;
          if ((uVar7 >> 10 & 1) == 0) {
            if ((bVar1 != 0) || (uVar20 == 0)) {
LAB_001ececd:
              dVar15 = (pIVar18->ExtentsX).Min;
              dVar16 = (pIVar18->ExtentsX).Max;
              uVar24 = -(ulong)(dVar27 < dVar15);
              uVar25 = -(ulong)(dVar16 < dVar27);
              auVar28._0_8_ = (ulong)dVar27 & uVar24;
              auVar28._8_8_ = (ulong)dVar27 & uVar25;
              auVar32._0_8_ = ~uVar24 & (ulong)dVar15;
              auVar32._8_8_ = ~uVar25 & (ulong)dVar16;
              pIVar18->ExtentsX = (ImPlotRange)(auVar32 | auVar28);
            }
          }
          else if (((pIVar11->YAxis[iVar6].Range.Min <= dVar14) &&
                   (dVar14 <= pIVar11->YAxis[iVar6].Range.Max)) &&
                  (local_88 = (byte)(uVar20 >> 5), (bVar1 == 0 & local_88) == 0)) goto LAB_001ececd;
          if ((uVar8 >> 10 & 1) == 0) {
            if ((bVar2 != 0) || (uVar22 == 0)) {
LAB_001ecf37:
              dVar27 = pIVar17[iVar6].Min;
              dVar15 = pIVar18->ExtentsY[iVar6].Max;
              uVar25 = -(ulong)(dVar14 < dVar27);
              uVar26 = -(ulong)(dVar15 < dVar14);
              uVar24 = (ulong)dVar14 & uVar26;
              auVar29._0_8_ = ~uVar25 & (ulong)dVar27;
              auVar29._8_8_ = ~uVar26 & (ulong)dVar15;
              auVar12._8_4_ = (int)uVar24;
              auVar12._0_8_ = (ulong)dVar14 & uVar25;
              auVar12._12_4_ = (int)(uVar24 >> 0x20);
              pIVar17[iVar6] = (ImPlotRange)(auVar29 | auVar12);
            }
          }
          else if ((((pIVar11->XAxis).Range.Min <= dVar27) && (dVar27 <= (pIVar11->XAxis).Range.Max)
                   ) && (local_84 = (byte)(uVar22 >> 5), (bVar2 == 0 & local_84) == 0))
          goto LAB_001ecf37;
          iVar23 = iVar23 + 1;
        } while (iVar3 != iVar23);
      }
      if ((fit2) && (iVar3 = getter2->Count, 0 < iVar3)) {
        puVar9 = getter2->Xs;
        puVar10 = getter2->Ys;
        iVar4 = getter2->Offset;
        iVar5 = getter2->Stride;
        pIVar11 = pIVar18->CurrentPlot;
        iVar6 = pIVar11->CurrentYAxis;
        uVar7 = (pIVar11->XAxis).Flags;
        uVar8 = pIVar11->YAxis[iVar6].Flags;
        iVar23 = 0;
        uVar20 = uVar7 & 0x20;
        uVar22 = uVar8 & 0x20;
        do {
          lVar21 = (long)(((iVar4 + iVar23) % iVar3 + iVar3) % iVar3) * (long)iVar5;
          bVar1 = puVar9[lVar21];
          dVar27 = (double)bVar1;
          bVar2 = puVar10[lVar21];
          dVar14 = (double)bVar2;
          if ((uVar7 >> 10 & 1) == 0) {
            if ((bVar1 != 0) || (uVar20 == 0)) {
LAB_001ed054:
              dVar15 = (pIVar18->ExtentsX).Min;
              dVar16 = (pIVar18->ExtentsX).Max;
              uVar24 = -(ulong)(dVar27 < dVar15);
              uVar25 = -(ulong)(dVar16 < dVar27);
              auVar30._0_8_ = (ulong)dVar27 & uVar24;
              auVar30._8_8_ = (ulong)dVar27 & uVar25;
              auVar33._0_8_ = ~uVar24 & (ulong)dVar15;
              auVar33._8_8_ = ~uVar25 & (ulong)dVar16;
              pIVar18->ExtentsX = (ImPlotRange)(auVar33 | auVar30);
            }
          }
          else if (((pIVar11->YAxis[iVar6].Range.Min <= dVar14) &&
                   (dVar14 <= pIVar11->YAxis[iVar6].Range.Max)) &&
                  (local_88 = (byte)(uVar20 >> 5), (bVar1 == 0 & local_88) == 0)) goto LAB_001ed054;
          if ((uVar8 >> 10 & 1) == 0) {
            if ((bVar2 != 0) || (uVar22 == 0)) {
LAB_001ed0bf:
              dVar27 = pIVar18->ExtentsY[iVar6].Min;
              dVar15 = pIVar18->ExtentsY[iVar6].Max;
              uVar25 = -(ulong)(dVar14 < dVar27);
              uVar26 = -(ulong)(dVar15 < dVar14);
              uVar24 = (ulong)dVar14 & uVar26;
              auVar31._0_8_ = ~uVar25 & (ulong)dVar27;
              auVar31._8_8_ = ~uVar26 & (ulong)dVar15;
              auVar13._8_4_ = (int)uVar24;
              auVar13._0_8_ = (ulong)dVar14 & uVar25;
              auVar13._12_4_ = (int)(uVar24 >> 0x20);
              pIVar18->ExtentsY[iVar6] = (ImPlotRange)(auVar31 | auVar13);
            }
          }
          else if ((((pIVar11->XAxis).Range.Min <= dVar27) && (dVar27 <= (pIVar11->XAxis).Range.Max)
                   ) && (local_84 = (byte)(uVar22 >> 5), (bVar2 == 0 & local_84) == 0))
          goto LAB_001ed0bf;
          iVar23 = iVar23 + 1;
        } while (iVar3 != iVar23);
      }
    }
    local_78 = getter2;
    local_70 = getter1;
    DrawList = GetPlotDrawList();
    if ((pIVar18->NextItemData).RenderFill == true) {
      col = ImGui::GetColorU32((pIVar18->NextItemData).Colors + 1);
      iVar3 = GImPlot->CurrentPlot->CurrentYAxis;
      switch(GImPlot->Scales[iVar3]) {
      case 0:
        local_7c.YAxis = iVar3;
        ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYs<unsigned_char>,_ImPlot::TransformerLinLin>
        ::ShadedRenderer(&local_60,local_70,local_78,&local_7c,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,ImPlot::GetterXsYs<unsigned_char>,ImPlot::TransformerLinLin>>
                  (&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 1:
        local_7c.YAxis = iVar3;
        ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYs<unsigned_char>,_ImPlot::TransformerLogLin>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYs<unsigned_char>,_ImPlot::TransformerLogLin>
                          *)&local_60,local_70,local_78,(TransformerLogLin *)&local_7c,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,ImPlot::GetterXsYs<unsigned_char>,ImPlot::TransformerLogLin>>
                  ((ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYs<unsigned_char>,_ImPlot::TransformerLogLin>
                    *)&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 2:
        local_7c.YAxis = iVar3;
        ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYs<unsigned_char>,_ImPlot::TransformerLinLog>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYs<unsigned_char>,_ImPlot::TransformerLinLog>
                          *)&local_60,local_70,local_78,(TransformerLinLog *)&local_7c,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,ImPlot::GetterXsYs<unsigned_char>,ImPlot::TransformerLinLog>>
                  ((ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYs<unsigned_char>,_ImPlot::TransformerLinLog>
                    *)&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 3:
        local_7c.YAxis = iVar3;
        ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYs<unsigned_char>,_ImPlot::TransformerLogLog>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYs<unsigned_char>,_ImPlot::TransformerLogLog>
                          *)&local_60,local_70,local_78,(TransformerLogLog *)&local_7c,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,ImPlot::GetterXsYs<unsigned_char>,ImPlot::TransformerLogLog>>
                  ((ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYs<unsigned_char>,_ImPlot::TransformerLogLog>
                    *)&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
      }
    }
    pIVar18 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar18->NextItemData);
    pIVar18->PreviousItem = pIVar18->CurrentItem;
    pIVar18->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

inline void PlotShadedEx(const char* label_id, const Getter1& getter1, const Getter2& getter2, bool fit2) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter1.Count; ++i)
                FitPoint(getter1(i));
            if (fit2) {
                for (int i = 0; i < getter2.Count; ++i)
                    FitPoint(getter2(i));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList & DrawList = *GetPlotDrawList();
        if (s.RenderFill) {
            ImU32 col = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLinLin>(getter1,getter2,TransformerLinLin(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LogLin: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLogLin>(getter1,getter2,TransformerLogLin(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LinLog: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLinLog>(getter1,getter2,TransformerLinLog(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LogLog: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLogLog>(getter1,getter2,TransformerLogLog(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
            }
        }
        EndItem();
    }
}